

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall pbrt::BasicScene::AddMedium(BasicScene *this,MediumSceneEntity *medium)

{
  AsyncJob<pbrt::Medium> *pAVar1;
  mapped_type *ppAVar2;
  InternedString *in_RSI;
  lock_guard<std::mutex> lock;
  anon_class_848_2_5de2c9c3_for__M_f create;
  anon_class_848_2_5de2c9c3_for__M_f *in_stack_fffffffffffff908;
  anon_class_848_2_5de2c9c3_for__M_f *in_stack_fffffffffffff910;
  key_type *in_stack_fffffffffffff948;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*>_>_>
  *in_stack_fffffffffffff950;
  anon_class_848_2_5de2c9c3_for__M_f *in_stack_fffffffffffffcd0;
  
  TransformedSceneEntity::TransformedSceneEntity
            (&in_stack_fffffffffffff910->medium,&in_stack_fffffffffffff908->medium);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffff910,
             (mutex_type *)in_stack_fffffffffffff908);
  AddMedium(pbrt::TransformedSceneEntity)::$_0::__0
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  pAVar1 = RunAsync<pbrt::BasicScene::AddMedium(pbrt::TransformedSceneEntity)::__0>
                     (in_stack_fffffffffffffcd0);
  InternedString::operator_cast_to_string_(in_RSI);
  ppAVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*>_>_>
            ::operator[](in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  *ppAVar2 = pAVar1;
  AddMedium(pbrt::TransformedSceneEntity)::$_0::~__0((anon_class_848_2_5de2c9c3_for__M_f *)0x526bba)
  ;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x526bc7);
  AddMedium(pbrt::TransformedSceneEntity)::$_0::~__0((anon_class_848_2_5de2c9c3_for__M_f *)0x526bd4)
  ;
  return;
}

Assistant:

void BasicScene::AddMedium(MediumSceneEntity medium) {
    // Define _create_ lambda function for _Medium_ creation
    auto create = [medium, this]() {
        std::string type = medium.parameters.GetOneString("type", "");
        // Check for missing medium ``type'' or animated medium transform
        if (type.empty())
            ErrorExit(&medium.loc, "No parameter \"string type\" found for medium.");
        if (medium.renderFromObject.IsAnimated())
            Warning(&medium.loc, "Animated transformation provided for medium. Only the "
                                 "start transform will be used.");

        return Medium::Create(type, medium.parameters,
                              medium.renderFromObject.startTransform, &medium.loc,
                              threadAllocators.Get());
    };

    std::lock_guard<std::mutex> lock(mediaMutex);
    mediumJobs[medium.name] = RunAsync(create);
}